

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalCommonGenerator::cmLocalCommonGenerator
          (cmLocalCommonGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf,string *wd)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator<char> local_41;
  string local_40;
  
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,mf);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_005e3270;
  std::__cxx11::string::string((string *)&this->WorkingDirectory,(string *)wd);
  (this->ConfigName)._M_dataplus._M_p = (pointer)&(this->ConfigName).field_2;
  (this->ConfigName)._M_string_length = 0;
  (this->ConfigName).field_2._M_local_buf[0] = '\0';
  this_00 = (this->super_cmLocalGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"CMAKE_BUILD_TYPE",&local_41);
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (pcVar1 == (char *)0x0) {
    (this->ConfigName)._M_string_length = 0;
    *(this->ConfigName)._M_dataplus._M_p = '\0';
  }
  else {
    std::__cxx11::string::assign((char *)&this->ConfigName);
  }
  return;
}

Assistant:

cmLocalCommonGenerator::cmLocalCommonGenerator(cmGlobalGenerator* gg,
                                               cmMakefile* mf, std::string wd)
  : cmLocalGenerator(gg, mf)
  , WorkingDirectory(std::move(wd))
{
  // Store the configuration name that will be generated.
  if (const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = config;
  } else {
    // No configuration type given.
    this->ConfigName.clear();
  }
}